

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator*=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  Fad<float> *pFVar10;
  long lVar11;
  Fad<float> *pFVar12;
  
  lVar11 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
           (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar11) {
    pFVar10 = this->fElem;
    pFVar12 = pFVar10 + lVar11;
    do {
      iVar3 = (value->dx_).num_elts;
      lVar11 = (long)iVar3;
      uVar4 = (pFVar10->dx_).num_elts;
      uVar9 = (ulong)uVar4;
      fVar1 = value->val_;
      if (lVar11 == 0) {
        if ((uVar9 != 0) && (0 < (int)uVar4)) {
          pfVar5 = (pFVar10->dx_).ptr_to_data;
          uVar8 = 0;
          do {
            pfVar5[uVar8] = pfVar5[uVar8] * fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      else {
        pfVar5 = (value->dx_).ptr_to_data;
        if (uVar9 == 0) {
          (pFVar10->dx_).num_elts = iVar3;
          uVar9 = lVar11 * 4;
          if (iVar3 < 0) {
            uVar9 = 0xffffffffffffffff;
          }
          pfVar6 = (float *)operator_new__(uVar9);
          (pFVar10->dx_).ptr_to_data = pfVar6;
          if (0 < iVar3) {
            fVar2 = pFVar10->val_;
            lVar7 = 0;
            do {
              pfVar6[lVar7] = pfVar5[lVar7] * fVar2;
              lVar7 = lVar7 + 1;
            } while (lVar11 != lVar7);
          }
        }
        else if (0 < (int)uVar4) {
          pfVar6 = (pFVar10->dx_).ptr_to_data;
          uVar8 = 0;
          do {
            pfVar6[uVar8] = pFVar10->val_ * pfVar5[uVar8] + pfVar6[uVar8] * fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      pFVar10->val_ = fVar1 * pFVar10->val_;
      pFVar10 = pFVar10 + 1;
    } while (pFVar10 < pFVar12);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}